

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_chi2_test<trng::exponential_dist<double>>(exponential_dist<double> *d)

{
  parameter_type P;
  StringRef capturedExpression;
  reference pvVar1;
  reference pvVar2;
  AssertionHandler catchAssertionHandler;
  double c2_p;
  vector<double,_std::allocator<double>_> p;
  int bin;
  result_type x;
  int i_1;
  lcg64_shift R;
  int i;
  vector<int,_std::allocator<int>_> count;
  vector<double,_std::allocator<double>_> quantil;
  int N;
  result_type dp;
  int bins;
  undefined4 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe60;
  AssertionHandler *this;
  allocator_type *in_stack_fffffffffffffe68;
  StringRef *macroName;
  value_type_conflict3 *in_stack_fffffffffffffe70;
  AssertionHandler *this_00;
  ExprLhs<bool> *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  ExprLhs<bool> *in_stack_fffffffffffffe88;
  AssertionHandler *in_stack_fffffffffffffe90;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  AssertionHandler local_148;
  StringRef *local_e0;
  undefined1 local_d1 [97];
  AssertionHandler *local_70;
  int local_68;
  undefined4 local_54;
  vector<int,_std::allocator<int>_> local_50;
  vector<double,_std::allocator<double>_> local_38;
  undefined4 local_1c;
  undefined8 local_18;
  undefined4 local_c;
  
  local_c = 0x80;
  local_18 = 0x3f80000000000000;
  local_1c = 10000;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x33a5b4);
  local_54 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x33a5d1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (size_type)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  std::allocator<int>::~allocator((allocator<int> *)0x33a5ff);
  for (local_68 = 1; local_68 < 0x80; local_68 = local_68 + 1) {
    in_stack_fffffffffffffe90 =
         (AssertionHandler *)
         trng::exponential_dist<double>::icdf
                   ((exponential_dist<double> *)in_stack_fffffffffffffe68,
                    (result_type_conflict2)in_stack_fffffffffffffe60);
    local_70 = in_stack_fffffffffffffe90;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffe60,
               (value_type_conflict6 *)
               CONCAT17(in_stack_fffffffffffffe5f,
                        CONCAT16(in_stack_fffffffffffffe5e,
                                 CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))));
  }
  local_d1._57_8_ = trng::lcg64_shift::Default;
  local_d1._65_8_ = DAT_005526e8;
  P.a._4_2_ = in_stack_fffffffffffffe5c;
  P.a._0_4_ = in_stack_fffffffffffffe58;
  P.a._6_1_ = in_stack_fffffffffffffe5e;
  P.a._7_1_ = in_stack_fffffffffffffe5f;
  P.b = (result_type)in_stack_fffffffffffffe60;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)0x33a6ee,P);
  for (local_d1._53_4_ = 0; (int)local_d1._53_4_ < 10000; local_d1._53_4_ = local_d1._53_4_ + 1) {
    in_stack_fffffffffffffe88 =
         (ExprLhs<bool> *)
         trng::exponential_dist<double>::operator()
                   ((exponential_dist<double> *)in_stack_fffffffffffffe60,
                    (lcg64_shift *)
                    CONCAT17(in_stack_fffffffffffffe5f,
                             CONCAT16(in_stack_fffffffffffffe5e,
                                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
                            ));
    local_d1._37_4_ = 0;
    local_d1._41_8_ = in_stack_fffffffffffffe88;
    while( true ) {
      in_stack_fffffffffffffe87 = false;
      if ((int)local_d1._37_4_ < 0x7f) {
        in_stack_fffffffffffffe78 = (ExprLhs<bool> *)local_d1._41_8_;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_38,(long)(int)local_d1._37_4_);
        in_stack_fffffffffffffe87 =
             *pvVar1 <= (double)in_stack_fffffffffffffe78 &&
             (double)in_stack_fffffffffffffe78 != *pvVar1;
      }
      if ((bool)in_stack_fffffffffffffe87 == false) break;
      local_d1._37_4_ = local_d1._37_4_ + 1;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&local_50,(long)(int)local_d1._37_4_);
    *pvVar2 = *pvVar2 + 1;
  }
  local_d1._1_8_ = 0x3f80000000000000;
  this_00 = (AssertionHandler *)local_d1;
  std::allocator<double>::allocator((allocator<double> *)0x33a7fb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (size_type)in_stack_fffffffffffffe78,(value_type_conflict6 *)this_00,
             (allocator_type *)in_stack_fffffffffffffe68);
  std::allocator<double>::~allocator((allocator<double> *)0x33a829);
  macroName = (StringRef *)chi_percentil(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_e0 = macroName;
  local_148.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffe60,
                  CONCAT17(in_stack_fffffffffffffe5f,
                           CONCAT16(in_stack_fffffffffffffe5e,
                                    CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))))
  ;
  this = &local_148;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xc2);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)macroName);
  capturedExpression.m_size._0_7_ = in_stack_fffffffffffffe80;
  capturedExpression.m_start = &in_stack_fffffffffffffe78->m_lhs;
  capturedExpression.m_size._7_1_ = in_stack_fffffffffffffe87;
  Catch::AssertionHandler::AssertionHandler
            (this_00,macroName,(SourceLineInfo *)this,capturedExpression,
             CONCAT13(in_stack_fffffffffffffe5f,
                      CONCAT12(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c)));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(0.01 < (double)local_e0 && (double)local_e0 < 0.99,
                      CONCAT16(in_stack_fffffffffffffe5e,
                               CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))),false
            );
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  return;
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}